

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::st_reusable_stuff::
default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>
::disp_data_source_t::distribute(disp_data_source_t *this,mbox_t *mbox)

{
  mbox_t *pmVar1;
  default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>
  *pdVar2;
  event_queue_impl_t *this_00;
  fake_activity_tracker_t *pfVar3;
  current_thread_id_t local_40;
  suffix_t local_38;
  size_t local_30;
  stats_t evt_queue_stats;
  suffix_t local_20;
  mbox_t *local_18;
  mbox_t *mbox_local;
  disp_data_source_t *this_local;
  
  local_18 = mbox;
  mbox_local = (mbox_t *)this;
  local_20 = stats::suffixes::agent_count();
  pdVar2 = outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>_>
           ::get(&this->m_dispatcher);
  evt_queue_stats.m_demands_count =
       default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
       ::agents_bound(&pdVar2->
                       super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
                     );
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long>
            (mbox,&this->m_base_prefix,&local_20,&evt_queue_stats.m_demands_count);
  pdVar2 = outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>_>
           ::get(&this->m_dispatcher);
  this_00 = default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
            ::event_queue(&pdVar2->
                           super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
                         );
  local_30 = (size_t)simple_not_mtsafe::impl::event_queue_impl_t::query_stats(this_00);
  pmVar1 = local_18;
  local_38 = stats::suffixes::work_thread_queue_size();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long_const&>
            (pmVar1,&this->m_base_prefix,&local_38,&local_30);
  pmVar1 = local_18;
  pdVar2 = outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>_>
           ::get(&this->m_dispatcher);
  local_40 = default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
             ::thread_id(&pdVar2->
                          super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
                        );
  pdVar2 = outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>_>
           ::get(&this->m_dispatcher);
  pfVar3 = activity_tracker(pdVar2);
  send_thread_activity_stats(pmVar1,&this->m_base_prefix,&local_40,pfVar3);
  return;
}

Assistant:

virtual void
				distribute( const mbox_t & mbox ) override
					{
						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								m_base_prefix,
								stats::suffixes::agent_count(),
								m_dispatcher.get().agents_bound() );

						const auto evt_queue_stats =
								m_dispatcher.get().event_queue().query_stats();
						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								m_base_prefix,
								stats::suffixes::work_thread_queue_size(),
								evt_queue_stats.m_demands_count );

						send_thread_activity_stats(
								mbox,
								m_base_prefix,
								m_dispatcher.get().thread_id(),
								m_dispatcher.get().activity_tracker() );
					}